

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLinOp::AnyInterpolationAmr
          (MLNodeLinOp *this,int famrlev,Any *a_fine,Any *a_crse,IntVect *nghost)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  double *pdVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  double dVar34;
  double dVar35;
  MFIter mfi;
  long local_218;
  ulong local_1e8;
  Box local_1a8;
  double *local_180;
  ulong local_178;
  long local_170;
  int local_164;
  int local_160;
  int local_15c;
  FabArray<amrex::FArrayBox> *local_158;
  ulong local_150;
  long local_148;
  FabArray<amrex::FArrayBox> *local_140;
  IntVect *local_138;
  long local_130;
  double *local_128;
  long local_120;
  ulong local_118;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  local_138 = nghost;
  local_158 = &Any::get<amrex::MultiFab>(a_fine)->super_FabArray<amrex::FArrayBox>;
  local_140 = &Any::get<amrex::MultiFab>(a_crse)->super_FabArray<amrex::FArrayBox>;
  uVar5 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  iVar3 = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [(long)famrlev + -1];
  if ((iVar3 != 2) && (iVar3 != 4)) {
    Assert_host("refratio == 2 || refratio == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
                ,0x1ed,(char *)0x0);
  }
  MFIter::MFIter(&local_90,&local_158->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_150 = (ulong)uVar5;
    do {
      MFIter::tilebox(&local_1a8,&local_90);
      iVar29 = (int)((ulong)*(undefined8 *)(local_138->vect + 1) >> 0x20);
      iVar17 = (int)*(undefined8 *)(local_138->vect + 1);
      local_1a8.bigend.vect[0] = local_138->vect[0] + local_1a8.bigend.vect[0];
      local_1a8.smallend.vect[0] = local_1a8.smallend.vect[0] - local_138->vect[0];
      local_1a8.smallend.vect[1] = local_1a8.smallend.vect[1] - iVar17;
      local_1a8.smallend.vect[2] = local_1a8.smallend.vect[2] - iVar29;
      iVar27 = local_1a8.bigend.vect[2];
      local_1a8.bigend.vect[1] = local_1a8.bigend.vect[1] + iVar17;
      local_1a8.bigend.vect[2] = iVar27 + iVar29;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,local_158,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,local_140,&local_90);
      if (iVar3 == 2) {
        if (0 < (int)uVar5) {
          local_170 = (long)local_1a8.smallend.vect[0];
          local_218 = 0;
          local_1e8 = 0;
          do {
            uVar4 = local_1a8.smallend.vect[2];
            if (local_1a8.smallend.vect[2] <= local_1a8.bigend.vect[2]) {
              do {
                if (local_1a8.smallend.vect[1] <= local_1a8.bigend.vect[1]) {
                  uVar6 = uVar4 + 1;
                  uVar15 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar15 = uVar6;
                  }
                  uVar15 = ~(uVar15 >> 1);
                  if (-1 < (int)uVar4) {
                    uVar15 = uVar4 >> 1;
                  }
                  uVar6 = uVar15 * 2;
                  uVar8 = local_1a8.smallend.vect[1];
                  do {
                    if (local_1a8.smallend.vect[0] <= local_1a8.bigend.vect[0]) {
                      uVar7 = uVar8 + 1;
                      uVar26 = -uVar7;
                      if (0 < (int)uVar7) {
                        uVar26 = uVar7;
                      }
                      lVar22 = local_110.nstride * local_1e8;
                      uVar26 = ~(uVar26 >> 1);
                      if (-1 < (int)uVar8) {
                        uVar26 = uVar8 >> 1;
                      }
                      uVar7 = uVar26 * 2;
                      lVar13 = local_110.jstride * (int)(uVar26 - local_110.begin.y);
                      lVar14 = (int)((uVar26 - local_110.begin.y) + 1) * local_110.jstride;
                      lVar18 = ((long)(int)uVar26 - (long)local_110.begin.y) * local_110.jstride;
                      lVar32 = (int)(uVar15 - local_110.begin.z) * local_110.kstride;
                      lVar31 = (int)((uVar15 + 1) - local_110.begin.z) * local_110.kstride;
                      lVar24 = ((long)(int)uVar15 - (long)local_110.begin.z) * local_110.kstride;
                      lVar28 = (long)local_110.begin.x;
                      pdVar1 = local_110.p + lVar14 + lVar24 + lVar22;
                      pdVar2 = local_110.p + lVar18 + lVar24 + lVar22;
                      lVar30 = 0;
                      do {
                        if (local_170 + lVar30 < 0) {
                          uVar16 = local_1a8.smallend.vect[0] + (int)lVar30 + 1;
                          uVar26 = -uVar16;
                          if (0 < (int)uVar16) {
                            uVar26 = uVar16;
                          }
                          uVar26 = ~(uVar26 >> 1);
                        }
                        else {
                          uVar26 = (uint)((ulong)(uint)local_1a8.smallend.vect[0] + lVar30 >> 1) &
                                   0x7fffffff;
                        }
                        iVar27 = uVar26 * 2;
                        iVar17 = local_1a8.smallend.vect[0] + (int)lVar30;
                        if ((iVar17 == iVar27 || uVar7 == uVar8) || (uVar6 == uVar4)) {
                          if (uVar7 == uVar8 || uVar6 == uVar4) {
                            if ((iVar17 != iVar27) && (uVar6 != uVar4)) {
                              iVar27 = uVar26 - local_110.begin.x;
                              dVar34 = local_110.p[lVar18 + (long)iVar27 + lVar32 + lVar22] +
                                       local_110.p[lVar18 + (long)iVar27 + lVar31 + lVar22];
                              lVar19 = lVar18 + (iVar27 + 1);
                              goto LAB_0076f3e4;
                            }
                            if (iVar17 == iVar27 || uVar7 == uVar8) {
                              if (iVar17 == iVar27) {
                                if (uVar7 != uVar8) {
                                  lVar19 = (int)uVar26 - lVar28;
                                  dVar34 = local_110.p[lVar13 + lVar24 + lVar22 + lVar19];
                                  pdVar25 = pdVar1;
                                  goto LAB_0076f4b8;
                                }
                                if (uVar6 == uVar4) {
                                  dVar34 = pdVar2[(int)uVar26 - lVar28];
                                  goto LAB_0076f3fc;
                                }
                                dVar34 = local_110.p
                                         [lVar18 + ((int)uVar26 - lVar28) + lVar32 + lVar22] +
                                         local_110.p
                                         [lVar18 + ((int)uVar26 - lVar28) + lVar31 + lVar22];
                              }
                              else {
                                dVar34 = pdVar2[(int)(uVar26 - local_110.begin.x)];
                                lVar19 = (long)(int)((uVar26 - local_110.begin.x) + 1);
                                pdVar25 = pdVar2;
LAB_0076f4b8:
                                dVar34 = dVar34 + pdVar25[lVar19];
                              }
                              dVar34 = dVar34 * 0.5;
                              goto LAB_0076f3fc;
                            }
                            iVar27 = uVar26 - local_110.begin.x;
                            dVar34 = local_110.p[lVar13 + lVar24 + lVar22 + iVar27] + pdVar1[iVar27]
                                     + local_110.p[lVar13 + lVar24 + lVar22 + (iVar27 + 1)] +
                                     pdVar1[iVar27 + 1];
                          }
                          else {
                            lVar19 = (int)uVar26 - lVar28;
                            dVar34 = local_110.p[lVar13 + lVar19 + lVar32 + lVar22] +
                                     local_110.p[lVar13 + lVar19 + lVar31 + lVar22];
                            lVar19 = lVar14 + lVar19;
LAB_0076f3e4:
                            dVar34 = dVar34 + (local_110.p + lVar19)[lVar32 + lVar22] +
                                     (local_110.p + lVar19)[lVar31 + lVar22];
                          }
                          dVar34 = dVar34 * 0.25;
                        }
                        else {
                          lVar19 = (long)(int)(uVar26 - local_110.begin.x);
                          lVar20 = (long)(int)((uVar26 - local_110.begin.x) + 1);
                          dVar34 = (local_110.p[lVar13 + lVar19 + lVar32 + lVar22] +
                                    local_110.p[lVar13 + lVar19 + lVar31 + lVar22] +
                                    local_110.p[lVar14 + lVar19 + lVar32 + lVar22] +
                                    local_110.p[lVar14 + lVar19 + lVar31 + lVar22] +
                                    local_110.p[lVar13 + lVar20 + lVar32 + lVar22] +
                                    local_110.p[lVar13 + lVar20 + lVar31 + lVar22] +
                                    local_110.p[lVar14 + lVar20 + lVar32 + lVar22] +
                                   local_110.p[lVar14 + lVar20 + lVar31 + lVar22]) * 0.125;
                        }
LAB_0076f3fc:
                        *(double *)
                         ((long)local_d0.p +
                         lVar30 * 8 +
                         local_d0.nstride * local_218 +
                         ((long)(int)uVar8 - (long)local_d0.begin.y) * local_d0.jstride * 8 +
                         ((long)(int)uVar4 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                         (long)local_d0.begin.x * -8 + local_170 * 8) = dVar34;
                        lVar30 = lVar30 + 1;
                      } while (~local_1a8.bigend.vect[0] + local_1a8.smallend.vect[0] + (int)lVar30
                               != 0);
                    }
                    bVar33 = uVar8 != local_1a8.bigend.vect[1];
                    uVar8 = uVar8 + 1;
                  } while (bVar33);
                }
                bVar33 = uVar4 != local_1a8.bigend.vect[2];
                uVar4 = uVar4 + 1;
              } while (bVar33);
            }
            local_1e8 = local_1e8 + 1;
            local_218 = local_218 + 8;
          } while (local_1e8 != local_150);
        }
      }
      else if (0 < (int)uVar5) {
        local_120 = (long)local_1a8.smallend.vect[0] * 8;
        local_160 = 4 - local_1a8.smallend.vect[0];
        local_170 = (ulong)(uint)~local_1a8.bigend.vect[0] + (ulong)(uint)local_1a8.smallend.vect[0]
        ;
        local_148 = 0;
        local_178 = 0;
        do {
          uVar4 = local_1a8.smallend.vect[2];
          if (local_1a8.smallend.vect[2] <= local_1a8.bigend.vect[2]) {
            do {
              if (local_1a8.smallend.vect[1] <= local_1a8.bigend.vect[1]) {
                uVar6 = uVar4 + 1;
                uVar15 = -uVar6;
                if (0 < (int)uVar6) {
                  uVar15 = uVar6;
                }
                uVar15 = ~(uVar15 >> 2);
                if (-1 < (int)uVar4) {
                  uVar15 = uVar4 >> 2;
                }
                local_118 = (ulong)uVar15;
                uVar8 = uVar15 * 4;
                local_15c = uVar15 + 1;
                iVar27 = (uVar15 * 4 + 4) - uVar4;
                iVar17 = uVar4 + uVar15 * -4;
                uVar6 = local_1a8.smallend.vect[1];
                do {
                  if (local_1a8.smallend.vect[0] <= local_1a8.bigend.vect[0]) {
                    uVar7 = uVar6 + 1;
                    uVar26 = -uVar7;
                    if (0 < (int)uVar7) {
                      uVar26 = uVar7;
                    }
                    lVar22 = local_110.nstride * local_178;
                    uVar26 = ~(uVar26 >> 2);
                    if (-1 < (int)uVar6) {
                      uVar26 = uVar6 >> 2;
                    }
                    lVar14 = ((long)(int)uVar15 - (long)local_110.begin.z) * local_110.kstride;
                    lVar24 = (int)(uVar15 - local_110.begin.z) * local_110.kstride;
                    lVar28 = (local_15c - local_110.begin.z) * local_110.kstride;
                    uVar7 = uVar26 * 4;
                    lVar31 = ((long)(int)uVar26 - (long)local_110.begin.y) * local_110.jstride;
                    lVar30 = (int)(uVar26 - local_110.begin.y) * local_110.jstride;
                    lVar32 = (int)((uVar26 + 1) - local_110.begin.y) * local_110.jstride;
                    iVar12 = (uVar26 * 4 + 4) - uVar6;
                    iVar9 = uVar6 + uVar26 * -4;
                    lVar13 = local_d0.nstride * local_148 +
                             ((long)(int)uVar6 - (long)local_d0.begin.y) * local_d0.jstride * 8 +
                             ((long)(int)uVar4 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                             (long)local_d0.begin.x * -8 + local_120;
                    lVar18 = (long)local_110.begin.x;
                    lVar19 = 0;
                    iVar29 = local_160;
                    do {
                      iVar10 = (int)lVar19;
                      if (local_1a8.smallend.vect[0] + lVar19 < 0) {
                        uVar16 = local_1a8.smallend.vect[0] + iVar10 + 1;
                        uVar26 = -uVar16;
                        if (0 < (int)uVar16) {
                          uVar26 = uVar16;
                        }
                        uVar26 = ~(uVar26 >> 2);
                      }
                      else {
                        uVar26 = (uint)((ulong)(uint)local_1a8.smallend.vect[0] + lVar19 >> 2) &
                                 0x3fffffff;
                      }
                      iVar11 = uVar26 * 4;
                      iVar23 = local_1a8.smallend.vect[0] + iVar10;
                      if ((iVar23 != iVar11 || uVar6 != uVar7) || (uVar4 != uVar8)) {
                        if (iVar23 != iVar11 || uVar6 != uVar7) {
                          if ((iVar23 == iVar11) && (uVar4 == uVar8)) {
                            dVar34 = local_110.p[lVar32 + lVar14 + lVar22 + ((int)uVar26 - lVar18)]
                                     * (double)iVar9;
                            dVar35 = local_110.p[lVar30 + lVar14 + lVar22 + ((int)uVar26 - lVar18)]
                                     * (double)iVar12;
                            goto LAB_0076f97b;
                          }
                          if (uVar6 == uVar7 && uVar4 == uVar8) {
                            dVar34 = ((double)(iVar29 + iVar11) *
                                      local_110.p
                                      [lVar31 + lVar14 + lVar22 + (int)(uVar26 - local_110.begin.x)]
                                     + (double)(int)(local_1a8.smallend.vect[0] + iVar10 +
                                                    uVar26 * -4) *
                                       local_110.p
                                       [lVar31 + lVar14 + lVar22 + (int)((uVar26 - local_110.begin.x
                                                                         ) + 1)]) * 0.25;
                            goto LAB_0076f8fb;
                          }
                          if (iVar23 != iVar11) {
                            if (uVar6 == uVar7) {
                              iVar23 = uVar26 - local_110.begin.x;
                              iVar10 = local_1a8.smallend.vect[0] + iVar10 + uVar26 * -4;
                              *(double *)((long)local_d0.p + lVar19 * 8 + lVar13) =
                                   ((double)(iVar10 * iVar17) *
                                    local_110.p[lVar31 + (long)(iVar23 + 1) + lVar28 + lVar22] +
                                   (double)((iVar29 + iVar11) * iVar17) *
                                   local_110.p[lVar31 + (long)iVar23 + lVar28 + lVar22] +
                                   (double)(iVar27 * (iVar29 + iVar11)) *
                                   local_110.p[lVar31 + (long)iVar23 + lVar24 + lVar22] +
                                   (double)(iVar27 * iVar10) *
                                   local_110.p[lVar31 + (long)(iVar23 + 1) + lVar24 + lVar22]) *
                                   0.0625;
                            }
                            else if (uVar4 == uVar8) {
                              iVar23 = uVar26 - local_110.begin.x;
                              iVar10 = local_1a8.smallend.vect[0] + iVar10 + uVar26 * -4;
                              *(double *)((long)local_d0.p + lVar19 * 8 + lVar13) =
                                   ((double)(iVar10 * iVar9) *
                                    local_110.p[lVar32 + lVar14 + lVar22 + (iVar23 + 1)] +
                                   (double)((iVar29 + iVar11) * iVar9) *
                                   local_110.p[lVar32 + lVar14 + lVar22 + iVar23] +
                                   (double)(iVar12 * (iVar29 + iVar11)) *
                                   local_110.p[lVar30 + lVar14 + lVar22 + iVar23] +
                                   (double)(iVar12 * iVar10) *
                                   local_110.p[lVar30 + lVar14 + lVar22 + (iVar23 + 1)]) * 0.0625;
                            }
                            else {
                              lVar20 = (long)(int)(uVar26 - local_110.begin.x);
                              local_164 = iVar12 * (iVar29 + iVar11);
                              local_130 = (long)(int)((uVar26 - local_110.begin.x) + 1);
                              local_128 = local_110.p + lVar30 + local_130;
                              iVar21 = local_1a8.smallend.vect[0] + iVar10 + uVar26 * -4;
                              iVar23 = iVar12 * iVar21;
                              local_180 = local_110.p + lVar32 + lVar20;
                              iVar10 = (iVar29 + iVar11) * iVar9;
                              iVar21 = iVar21 * iVar9;
                              *(double *)((long)local_d0.p + lVar19 * 8 + lVar13) =
                                   ((double)(iVar21 * iVar17) *
                                    local_110.p[lVar32 + local_130 + lVar28 + lVar22] +
                                   (double)(iVar10 * iVar17) * local_180[lVar28 + lVar22] +
                                   (double)(iVar23 * iVar17) * local_128[lVar28 + lVar22] +
                                   (double)(local_164 * iVar17) *
                                   local_110.p[lVar30 + lVar20 + lVar28 + lVar22] +
                                   (double)(iVar27 * iVar21) *
                                   local_110.p[lVar32 + local_130 + lVar24 + lVar22] +
                                   (double)(iVar27 * iVar10) * local_180[lVar24 + lVar22] +
                                   (double)(iVar27 * local_164) *
                                   local_110.p[lVar30 + lVar20 + lVar24 + lVar22] +
                                   (double)(iVar27 * iVar23) * local_128[lVar24 + lVar22]) *
                                   0.015625;
                            }
                            goto LAB_0076f98b;
                          }
                          lVar20 = (int)uVar26 - lVar18;
                          dVar34 = (local_110.p[lVar32 + lVar20 + lVar28 + lVar22] *
                                    (double)(iVar17 * iVar9) +
                                   local_110.p[lVar30 + lVar20 + lVar28 + lVar22] *
                                   (double)(iVar17 * iVar12) +
                                   local_110.p[lVar30 + lVar20 + lVar24 + lVar22] *
                                   (double)(iVar27 * iVar12) +
                                   local_110.p[lVar32 + lVar20 + lVar24 + lVar22] *
                                   (double)(iVar27 * iVar9)) * 0.0625;
                        }
                        else {
                          dVar34 = local_110.p[lVar31 + ((int)uVar26 - lVar18) + lVar28 + lVar22] *
                                   (double)iVar17;
                          dVar35 = local_110.p[lVar31 + ((int)uVar26 - lVar18) + lVar24 + lVar22] *
                                   (double)iVar27;
LAB_0076f97b:
                          dVar34 = (dVar35 + dVar34) * 0.25;
                        }
                        *(double *)((long)local_d0.p + lVar19 * 8 + lVar13) = dVar34;
                      }
                      else {
                        dVar34 = local_110.p[lVar31 + lVar14 + lVar22 + ((int)uVar26 - lVar18)];
LAB_0076f8fb:
                        *(double *)((long)local_d0.p + lVar19 * 8 + lVar13) = dVar34;
                      }
LAB_0076f98b:
                      lVar19 = lVar19 + 1;
                      iVar29 = iVar29 + -1;
                    } while ((int)local_170 + (int)lVar19 != 0);
                  }
                  bVar33 = uVar6 != local_1a8.bigend.vect[1];
                  uVar6 = uVar6 + 1;
                } while (bVar33);
              }
              bVar33 = uVar4 != local_1a8.bigend.vect[2];
              uVar4 = uVar4 + 1;
            } while (bVar33);
          }
          local_178 = local_178 + 1;
          local_148 = local_148 + 8;
        } while (local_178 != local_150);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLNodeLinOp::AnyInterpolationAmr (int famrlev, Any& a_fine, const Any& a_crse,
                                  IntVect const& nghost) const
{
    AMREX_ASSERT(a_fine.is<MultiFab>());
    MultiFab& fine = a_fine.get<MultiFab>();
    MultiFab const& crse = a_crse.get<MultiFab>();

    const int ncomp = getNComp();
    const int refratio = AMRRefRatio(famrlev-1);

    AMREX_ALWAYS_ASSERT(refratio == 2 || refratio == 4);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        Box fbx = mfi.tilebox();
        fbx.grow(nghost);
        Array4<Real> const& ffab = fine.array(mfi);
        Array4<Real const> const& cfab = crse.const_array(mfi);

        if (refratio == 2) {
            AMREX_HOST_DEVICE_FOR_4D ( fbx, ncomp, i, j, k, n,
            {
                mlmg_lin_nd_interp_r2(i,j,k,n,ffab,cfab);
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D ( fbx, ncomp, i, j, k, n,
            {
                mlmg_lin_nd_interp_r4(i,j,k,n,ffab,cfab);
            });
        }
    }
}